

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O3

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownPrefixFilter
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  pointer pcVar1;
  int iVar2;
  BoundFunctionExpression *pBVar3;
  reference pvVar4;
  pointer pEVar5;
  BoundColumnRefExpression *pBVar6;
  BoundConstantExpression *pBVar7;
  string *psVar8;
  const_reference col_idx;
  ConstantFilter *this_00;
  ConstantFilter *this_01;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_02;
  FilterPushdownResult FVar9;
  string prefix_string;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_120;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_118;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  string local_f0;
  string local_d0;
  Value local_b0;
  Value local_70;
  
  FVar9 = NO_PUSHDOWN;
  if ((expr->super_BaseExpression).expression_class == BOUND_FUNCTION) {
    pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&expr->super_BaseExpression);
    iVar2 = ::std::__cxx11::string::compare
                      ((char *)&(pBVar3->function).super_BaseScalarFunction.super_SimpleFunction.
                                super_Function.name);
    FVar9 = NO_PUSHDOWN;
    if (iVar2 == 0) {
      this_02 = &pBVar3->children;
      FVar9 = NO_PUSHDOWN;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this_02,0);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      if ((pEVar5->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](this_02,1);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar4);
        if ((pEVar5->super_BaseExpression).type == VALUE_CONSTANT) {
          FVar9 = NO_PUSHDOWN;
          pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](this_02,0);
          pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar4);
          pBVar6 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                             (&pEVar5->super_BaseExpression);
          pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](this_02,1);
          pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar4);
          pBVar7 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                             (&pEVar5->super_BaseExpression);
          psVar8 = StringValue::Get_abi_cxx11_(&pBVar7->value);
          local_110 = local_100;
          pcVar1 = (psVar8->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,pcVar1,pcVar1 + psVar8->_M_string_length);
          if (local_108 != 0) {
            col_idx = vector<duckdb::ColumnIndex,_true>::operator[]
                                (column_ids,(pBVar6->binding).column_index);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_110,local_110 + local_108);
            Value::Value(&local_b0,&local_d0);
            this_00 = (ConstantFilter *)operator_new(0x50);
            Value::Value(&local_70,&local_b0);
            ConstantFilter::ConstantFilter(this_00,COMPARE_GREATERTHANOREQUALTO,&local_70);
            Value::~Value(&local_70);
            Value::~Value(&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            local_110[local_108 + -1] = local_110[local_108 + -1] + '\x01';
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,local_110,local_110 + local_108);
            Value::Value(&local_b0,&local_f0);
            this_01 = (ConstantFilter *)operator_new(0x50);
            Value::Value(&local_70,&local_b0);
            ConstantFilter::ConstantFilter(this_01,COMPARE_LESSTHAN,&local_70);
            Value::~Value(&local_70);
            Value::~Value(&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            local_118._M_head_impl = (TableFilter *)this_00;
            TableFilterSet::PushFilter
                      (table_filters,col_idx,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_118);
            if ((ConstantFilter *)local_118._M_head_impl != (ConstantFilter *)0x0) {
              (*((TableFilter *)&(local_118._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])
                        ();
            }
            local_118._M_head_impl = (TableFilter *)0x0;
            local_120._M_head_impl = (TableFilter *)this_01;
            TableFilterSet::PushFilter
                      (table_filters,col_idx,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_120);
            if ((ConstantFilter *)local_120._M_head_impl != (ConstantFilter *)0x0) {
              (*((TableFilter *)&(local_120._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])
                        ();
            }
            local_120._M_head_impl = (TableFilter *)0x0;
            FVar9 = PUSHED_DOWN_FULLY;
          }
          if (local_110 != local_100) {
            operator_delete(local_110);
          }
        }
      }
    }
  }
  return FVar9;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownPrefixFilter(TableFilterSet &table_filters,
                                                             const vector<ColumnIndex> &column_ids, Expression &expr) {
	if (expr.GetExpressionClass() != ExpressionClass::BOUND_FUNCTION) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &func = expr.Cast<BoundFunctionExpression>();
	if (func.function.name != "prefix") {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	if (func.children[0]->GetExpressionClass() != ExpressionClass::BOUND_COLUMN_REF ||
	    func.children[1]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
		// we need prefix(col, 'literal') in order to push this down
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &column_ref = func.children[0]->Cast<BoundColumnRefExpression>();
	auto &constant_value_expr = func.children[1]->Cast<BoundConstantExpression>();
	auto prefix_string = StringValue::Get(constant_value_expr.value);
	if (prefix_string.empty()) {
		// empty prefix - skip
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &column_index = column_ids[column_ref.binding.column_index];
	//! Replace prefix with a set of comparisons
	auto lower_bound = make_uniq<ConstantFilter>(ExpressionType::COMPARE_GREATERTHANOREQUALTO, Value(prefix_string));
	prefix_string[prefix_string.size() - 1]++;
	auto upper_bound = make_uniq<ConstantFilter>(ExpressionType::COMPARE_LESSTHAN, Value(prefix_string));
	table_filters.PushFilter(column_index, std::move(lower_bound));
	table_filters.PushFilter(column_index, std::move(upper_bound));
	return FilterPushdownResult::PUSHED_DOWN_FULLY;
}